

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_12_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  float *data;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  float *pfVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  float *pfVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  bool bVar49;
  byte bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [12];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar97 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  int data_width;
  float local_138;
  
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  auVar91 = ZEXT1664(auVar58);
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar95 = ZEXT1664(auVar59);
  fVar66 = ipoint->scale;
  auVar100 = ZEXT464((uint)fVar66);
  auVar51 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)fVar66),auVar58,0xf8);
  auVar51 = ZEXT416((uint)(fVar66 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  iVar46 = (int)auVar51._0_4_;
  fVar64 = -0.08 / (fVar66 * fVar66);
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->x),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->x + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53._0_8_ = (double)auVar52._0_4_;
  auVar53._8_8_ = auVar52._8_8_;
  auVar57._0_8_ = (double)fVar66;
  auVar57._8_8_ = 0;
  auVar52 = vfmadd231sd_fma(auVar53,auVar57,ZEXT816(0x3fe0000000000000));
  auVar56._0_4_ = (float)auVar52._0_8_;
  auVar56._4_12_ = auVar52._4_12_;
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->y),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->y + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54._0_8_ = (double)auVar52._0_4_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar52 = vfmadd231sd_fma(auVar54,auVar57,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar52._0_8_;
  auVar55._4_12_ = auVar52._4_12_;
  auVar52._0_4_ = (int)auVar51._0_4_;
  auVar52._4_4_ = (int)auVar51._4_4_;
  auVar52._8_4_ = (int)auVar51._8_4_;
  auVar52._12_4_ = (int)auVar51._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar52);
  fVar2 = auVar56._0_4_ - auVar51._0_4_;
  auVar53 = ZEXT416((uint)fVar2);
  fVar3 = auVar55._0_4_ - auVar51._0_4_;
  auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar66),auVar56);
  auVar52 = vpternlogd_avx512vl(auVar59,auVar51,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  if (iVar46 < (int)auVar51._0_4_) {
    auVar54 = ZEXT416((uint)fVar66);
    auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar54,auVar55);
    auVar60._8_4_ = 0x3effffff;
    auVar60._0_8_ = 0x3effffff3effffff;
    auVar60._12_4_ = 0x3effffff;
    auVar61._8_4_ = 0x80000000;
    auVar61._0_8_ = 0x8000000080000000;
    auVar61._12_4_ = 0x80000000;
    auVar52 = vpternlogd_avx512vl(auVar61,auVar51,auVar60,0xea);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
    if (iVar46 < (int)auVar51._0_4_) {
      auVar51 = vfmadd231ss_fma(auVar56,auVar54,ZEXT416(0x41300000));
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar52 = vpternlogd_avx512vl(auVar62,auVar51,auVar60,0xea);
      auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      if ((int)auVar51._0_4_ + iVar46 <= iimage->width) {
        auVar51 = vfmadd231ss_fma(auVar55,auVar54,ZEXT416(0x41300000));
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar52 = vpternlogd_avx512vl(auVar60,auVar51,auVar11,0xf8);
        auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
        auVar51 = vroundss_avx(auVar51,auVar51,0xb);
        if ((int)auVar51._0_4_ + iVar46 <= iimage->height) {
          fVar2 = fVar2 + 0.5;
          pfVar38 = iimage->data;
          iVar1 = iimage->data_width;
          iVar47 = iVar46 * 2;
          pfVar39 = haarResponseY + 0x23;
          pfVar34 = haarResponseX + 0x23;
          uVar22 = 0xfffffff4;
          do {
            auVar51._0_4_ = (float)(int)uVar22;
            auVar51._4_12_ = in_ZMM8._4_12_;
            auVar51 = vfmadd213ss_fma(auVar51,auVar54,ZEXT416((uint)(fVar3 + 0.5)));
            iVar16 = (int)auVar51._0_4_;
            auVar78._0_4_ = (float)(int)(uVar22 | 1);
            auVar78._4_12_ = in_ZMM8._4_12_;
            auVar51 = vfmadd213ss_fma(auVar78,auVar54,ZEXT416((uint)(fVar3 + 0.5)));
            iVar18 = (int)auVar51._0_4_;
            iVar17 = (iVar16 + -1) * iVar1;
            iVar15 = (iVar16 + -1 + iVar46) * iVar1;
            iVar19 = (iVar16 + -1 + iVar47) * iVar1;
            iVar20 = (iVar18 + -1) * iVar1;
            iVar16 = (iVar18 + -1 + iVar46) * iVar1;
            iVar18 = (iVar18 + -1 + iVar47) * iVar1;
            lVar28 = 0;
            do {
              iVar42 = (int)lVar28;
              auVar79._0_4_ = (float)(iVar42 + -0xc);
              auVar79._4_12_ = in_ZMM8._4_12_;
              auVar51 = vfmadd213ss_fma(auVar79,auVar54,ZEXT416((uint)fVar2));
              iVar44 = (int)auVar51._0_4_;
              auVar80._0_4_ = (float)(iVar42 + -0xb);
              auVar94._4_12_ = auVar95._4_12_;
              auVar80._4_12_ = auVar94._4_12_;
              auVar51 = vfmadd213ss_fma(auVar80,auVar54,ZEXT416((uint)fVar2));
              iVar30 = (int)auVar51._0_4_;
              auVar81._0_4_ = (float)(iVar42 + -10);
              auVar81._4_12_ = auVar94._4_12_;
              auVar52 = ZEXT416((uint)fVar2);
              auVar51 = vfmadd213ss_fma(auVar81,auVar54,auVar52);
              iVar33 = (int)auVar51._0_4_;
              auVar82._0_4_ = (float)(iVar42 + -9);
              auVar82._4_12_ = auVar94._4_12_;
              auVar51 = vfmadd213ss_fma(auVar82,auVar54,auVar52);
              iVar25 = (int)auVar51._0_4_;
              auVar83._0_4_ = (float)(iVar42 + -8);
              auVar83._4_12_ = auVar94._4_12_;
              auVar51 = vfmadd213ss_fma(auVar83,auVar54,auVar52);
              iVar32 = (int)auVar51._0_4_;
              auVar97._0_4_ = (float)(iVar42 + -7);
              auVar97._4_12_ = auVar94._4_12_;
              auVar51 = vfmadd213ss_fma(auVar97,auVar54,auVar52);
              auVar96._0_4_ = (float)(iVar42 + -6);
              auVar96._4_12_ = auVar94._4_12_;
              auVar94._0_4_ = (float)(iVar42 + -5);
              auVar90._0_4_ = (float)(iVar42 + -4);
              auVar92 = in_ZMM10._4_12_;
              auVar90._4_12_ = auVar92;
              auVar89._0_4_ = (float)(iVar42 + -3);
              auVar89._4_12_ = auVar92;
              auVar88._0_4_ = (float)(iVar42 + -2);
              auVar88._4_12_ = auVar92;
              auVar84._0_4_ = (float)(iVar42 + -1);
              auVar84._4_12_ = auVar92;
              iVar21 = iVar44 + -1 + iVar46;
              iVar35 = iVar44 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar44];
              fVar71 = pfVar38[iVar19 + -1 + iVar44];
              fVar75 = pfVar38[iVar19 + iVar35];
              fVar85 = pfVar38[iVar17 + -1 + iVar44];
              fVar72 = pfVar38[iVar17 + iVar35];
              auVar55 = SUB6416(ZEXT464(0x40000000),0);
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar21] -
                                                      pfVar38[iVar19 + iVar21])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar35];
              pfVar34[lVar28 + -0x23] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x23] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar44];
              fVar71 = pfVar38[iVar18 + -1 + iVar44];
              fVar75 = pfVar38[iVar35 + iVar18];
              iVar48 = (int)auVar51._0_4_;
              fVar85 = pfVar38[iVar20 + -1 + iVar44];
              fVar72 = pfVar38[iVar20 + iVar35];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar21] -
                                                      pfVar38[iVar21 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar35];
              pfVar34[lVar28 + -0xb] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0xb] = auVar51._0_4_ - (fVar71 - fVar72);
              iVar44 = iVar30 + -1 + iVar46;
              iVar21 = iVar30 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar30];
              fVar71 = pfVar38[iVar19 + -1 + iVar30];
              fVar75 = pfVar38[iVar19 + iVar21];
              fVar85 = pfVar38[iVar17 + -1 + iVar30];
              fVar72 = pfVar38[iVar17 + iVar21];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar21];
              pfVar34[lVar28 + -0x22] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x22] = auVar51._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar30];
              fVar71 = pfVar38[iVar18 + -1 + iVar30];
              fVar75 = pfVar38[iVar21 + iVar18];
              auVar53 = ZEXT416((uint)fVar2);
              auVar51 = vfmadd213ss_fma(auVar96,auVar54,auVar53);
              fVar85 = pfVar38[iVar20 + -1 + iVar30];
              fVar72 = pfVar38[iVar20 + iVar21];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar21];
              pfVar34[lVar28 + -10] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              iVar44 = iVar33 + -1 + iVar46;
              iVar30 = iVar33 + -1 + iVar47;
              pfVar39[lVar28 + -10] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar15 + -1 + iVar33];
              fVar71 = pfVar38[iVar19 + -1 + iVar33];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar33];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x21] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x21] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar33];
              fVar71 = pfVar38[iVar18 + -1 + iVar33];
              fVar75 = pfVar38[iVar30 + iVar18];
              iVar21 = (int)auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(auVar94,auVar54,auVar53);
              fVar85 = pfVar38[iVar20 + -1 + iVar33];
              fVar72 = pfVar38[iVar20 + iVar30];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar30];
              pfVar34[lVar28 + -9] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -9] = auVar52._0_4_ - (fVar71 - fVar72);
              iVar44 = iVar25 + -1 + iVar46;
              iVar30 = iVar25 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar25];
              fVar71 = pfVar38[iVar19 + -1 + iVar25];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar25];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x20] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x20] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar25];
              fVar71 = pfVar38[iVar18 + -1 + iVar25];
              fVar75 = pfVar38[iVar30 + iVar18];
              iVar33 = (int)auVar51._0_4_;
              fVar85 = pfVar38[iVar20 + -1 + iVar25];
              fVar72 = pfVar38[iVar20 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar30];
              pfVar34[lVar28 + -8] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -8] = auVar51._0_4_ - (fVar71 - fVar72);
              iVar44 = iVar32 + -1 + iVar46;
              iVar30 = iVar32 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar32];
              fVar71 = pfVar38[iVar19 + -1 + iVar32];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar32];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x1f] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1f] = auVar51._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar32];
              fVar71 = pfVar38[iVar18 + -1 + iVar32];
              fVar75 = pfVar38[iVar30 + iVar18];
              auVar51 = vfmadd213ss_fma(auVar90,auVar54,auVar53);
              fVar85 = pfVar38[iVar20 + -1 + iVar32];
              fVar72 = pfVar38[iVar20 + iVar30];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar30];
              pfVar34[lVar28 + -7] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              iVar44 = iVar48 + -1 + iVar46;
              iVar30 = iVar48 + -1 + iVar47;
              pfVar39[lVar28 + -7] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar15 + -1 + iVar48];
              fVar71 = pfVar38[iVar19 + -1 + iVar48];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar48];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x1e] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1e] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar48];
              fVar71 = pfVar38[iVar18 + -1 + iVar48];
              in_ZMM10 = ZEXT464((uint)pfVar38[iVar30 + iVar18]);
              iVar25 = (int)auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(auVar89,auVar54,auVar53);
              fVar75 = pfVar38[iVar20 + iVar30];
              auVar56 = ZEXT416((uint)(pfVar38[iVar30 + iVar18] - pfVar38[iVar20 + -1 + iVar48]));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,auVar56);
              fVar85 = pfVar38[iVar16 + iVar30];
              pfVar34[lVar28 + -6] = (fVar71 - fVar75) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar85)),auVar55,auVar56);
              pfVar39[lVar28 + -6] = auVar52._0_4_ - (fVar71 - fVar75);
              iVar32 = iVar21 + -1 + iVar46;
              iVar44 = iVar21 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar21];
              fVar71 = pfVar38[iVar19 + -1 + iVar21];
              fVar75 = pfVar38[iVar19 + iVar44];
              fVar85 = pfVar38[iVar17 + -1 + iVar21];
              fVar72 = pfVar38[iVar17 + iVar44];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar32] -
                                                      pfVar38[iVar19 + iVar32])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar44];
              pfVar34[lVar28 + -0x1d] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1d] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar21];
              fVar71 = pfVar38[iVar18 + -1 + iVar21];
              fVar75 = pfVar38[iVar44 + iVar18];
              iVar30 = (int)auVar51._0_4_;
              fVar85 = pfVar38[iVar20 + -1 + iVar21];
              fVar72 = pfVar38[iVar20 + iVar44];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar32] -
                                                      pfVar38[iVar32 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar44];
              pfVar34[lVar28 + -5] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -5] = auVar51._0_4_ - (fVar71 - fVar72);
              iVar44 = iVar33 + -1 + iVar46;
              iVar21 = iVar33 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar33];
              fVar71 = pfVar38[iVar19 + -1 + iVar33];
              fVar75 = pfVar38[iVar19 + iVar21];
              fVar85 = pfVar38[iVar17 + -1 + iVar33];
              fVar72 = pfVar38[iVar17 + iVar21];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar21];
              pfVar34[lVar28 + -0x1c] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1c] = auVar51._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar33];
              fVar71 = pfVar38[iVar18 + -1 + iVar33];
              fVar75 = pfVar38[iVar21 + iVar18];
              auVar51 = vfmadd213ss_fma(auVar88,auVar54,auVar53);
              fVar85 = pfVar38[iVar20 + -1 + iVar33];
              fVar72 = pfVar38[iVar20 + iVar21];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar21];
              pfVar34[lVar28 + -4] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              iVar21 = iVar25 + -1 + iVar46;
              iVar44 = iVar25 + -1 + iVar47;
              pfVar39[lVar28 + -4] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar15 + -1 + iVar25];
              fVar71 = pfVar38[iVar19 + -1 + iVar25];
              fVar75 = pfVar38[iVar19 + iVar44];
              fVar85 = pfVar38[iVar17 + -1 + iVar25];
              fVar72 = pfVar38[iVar17 + iVar44];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar21] -
                                                      pfVar38[iVar19 + iVar21])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar44];
              pfVar34[lVar28 + -0x1b] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1b] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar25];
              fVar71 = pfVar38[iVar18 + -1 + iVar25];
              in_ZMM8 = ZEXT464((uint)pfVar38[iVar44 + iVar18]);
              iVar32 = (int)auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar66),auVar53);
              fVar75 = pfVar38[iVar20 + iVar44];
              auVar53 = ZEXT416((uint)(pfVar38[iVar44 + iVar18] - pfVar38[iVar20 + -1 + iVar25]));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar21] -
                                                      pfVar38[iVar21 + iVar18])),auVar55,auVar53);
              fVar85 = pfVar38[iVar16 + iVar44];
              pfVar34[lVar28 + -3] = (fVar71 - fVar75) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar85)),auVar55,auVar53);
              pfVar39[lVar28 + -3] = auVar52._0_4_ - (fVar71 - fVar75);
              iVar44 = iVar30 + -1 + iVar46;
              iVar21 = iVar30 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar30];
              fVar71 = pfVar38[iVar19 + -1 + iVar30];
              fVar75 = pfVar38[iVar19 + iVar21];
              fVar85 = pfVar38[iVar17 + -1 + iVar30];
              fVar72 = pfVar38[iVar17 + iVar21];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar21];
              pfVar34[lVar28 + -0x1a] = (fVar71 - fVar72) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x1a] = auVar52._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar30];
              fVar71 = pfVar38[iVar18 + -1 + iVar30];
              auVar95 = ZEXT464((uint)pfVar38[iVar21 + iVar18]);
              iVar33 = (int)auVar51._0_4_;
              fVar75 = pfVar38[iVar20 + iVar21];
              auVar52 = ZEXT416((uint)(pfVar38[iVar21 + iVar18] - pfVar38[iVar20 + -1 + iVar30]));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,auVar52);
              fVar85 = pfVar38[iVar16 + iVar21];
              pfVar34[lVar28 + -2] = (fVar71 - fVar75) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar85)),auVar55,auVar52);
              pfVar39[lVar28 + -2] = auVar51._0_4_ - (fVar71 - fVar75);
              iVar44 = iVar32 + -1 + iVar46;
              iVar30 = iVar32 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar32];
              fVar71 = pfVar38[iVar19 + -1 + iVar32];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar32];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x19] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x19] = auVar51._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar32];
              fVar71 = pfVar38[iVar18 + -1 + iVar32];
              fVar75 = pfVar38[iVar30 + iVar18];
              fVar85 = pfVar38[iVar20 + -1 + iVar32];
              fVar72 = pfVar38[iVar20 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar16 + iVar30];
              pfVar34[lVar28 + -1] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -1] = auVar51._0_4_ - (fVar71 - fVar72);
              iVar44 = iVar33 + -1 + iVar46;
              iVar30 = iVar33 + -1 + iVar47;
              fVar65 = pfVar38[iVar15 + -1 + iVar33];
              fVar71 = pfVar38[iVar19 + -1 + iVar33];
              fVar75 = pfVar38[iVar19 + iVar30];
              fVar85 = pfVar38[iVar17 + -1 + iVar33];
              fVar72 = pfVar38[iVar17 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar44] -
                                                      pfVar38[iVar19 + iVar44])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              fVar4 = pfVar38[iVar15 + iVar30];
              pfVar34[lVar28 + -0x18] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28 + -0x18] = auVar51._0_4_ - (fVar71 - fVar72);
              fVar65 = pfVar38[iVar16 + -1 + iVar33];
              fVar71 = pfVar38[iVar18 + -1 + iVar33];
              fVar75 = pfVar38[iVar30 + iVar18];
              fVar85 = pfVar38[iVar20 + -1 + iVar33];
              fVar72 = pfVar38[iVar20 + iVar30];
              fVar4 = pfVar38[iVar16 + iVar30];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar44] -
                                                      pfVar38[iVar44 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar34[lVar28] = (fVar71 - fVar72) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),auVar55,
                                        ZEXT416((uint)(fVar75 - fVar85)));
              pfVar39[lVar28] = auVar51._0_4_ - (fVar71 - fVar72);
              lVar28 = lVar28 + 0xc;
            } while (iVar42 + -0xc < 0);
            pfVar39 = pfVar39 + 0x30;
            pfVar34 = pfVar34 + 0x30;
            bVar49 = (int)uVar22 < 10;
            uVar22 = uVar22 + 2;
          } while (bVar49);
          goto LAB_001cc6ac;
        }
      }
    }
  }
  iVar1 = iVar46 * 2;
  lVar28 = 0;
  uVar22 = 0xfffffff4;
  do {
    auVar67._0_4_ = (float)(int)uVar22;
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar69._0_4_ = (float)(int)(uVar22 | 1);
    auVar69._4_12_ = in_ZMM8._4_12_;
    auVar51 = vfmadd213ss_fma(auVar67,auVar100._0_16_,ZEXT416((uint)fVar3));
    auVar52 = vfmadd213ss_fma(auVar69,auVar100._0_16_,ZEXT416((uint)fVar3));
    fVar65 = auVar51._0_4_;
    iVar42 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    fVar65 = auVar52._0_4_;
    iVar44 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar15 = iVar1 + iVar42;
    iVar16 = iVar42 + -1;
    iVar17 = iVar42 + -1 + iVar46;
    iVar18 = iVar1 + iVar44;
    iVar19 = iVar44 + -1;
    iVar20 = iVar44 + -1 + iVar46;
    lVar27 = lVar28;
    iVar47 = -0xc;
    do {
      auVar68._0_4_ = (float)iVar47;
      auVar92 = auVar91._4_12_;
      auVar68._4_12_ = auVar92;
      auVar55 = auVar100._0_16_;
      auVar51 = vfmadd213ss_fma(auVar68,auVar55,auVar53);
      auVar86._0_4_ = (float)(iVar47 + 1);
      auVar86._4_12_ = auVar92;
      auVar52 = vfmadd213ss_fma(auVar86,auVar55,auVar53);
      auVar76._0_4_ = (float)(iVar47 + 2);
      auVar76._4_12_ = auVar92;
      auVar54 = vfmadd213ss_fma(auVar76,auVar55,auVar53);
      auVar73._0_4_ = (float)(iVar47 + 3);
      auVar73._4_12_ = auVar92;
      auVar55 = vfmadd213ss_fma(auVar73,auVar55,auVar53);
      fVar65 = auVar51._0_4_;
      fVar85 = auVar52._0_4_;
      fVar75 = auVar54._0_4_;
      fVar71 = auVar55._0_4_;
      pfVar38 = (float *)((long)haarResponseY + lVar27);
      iVar30 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if ((((iVar42 < 1) || (iVar30 < 1)) || (iimage->height < iVar15)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,(float *)((long)haarResponseX + lVar27),pfVar38);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar39 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar39[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar72 = pfVar39[iVar35 + -1 + iVar30];
        fVar4 = pfVar39[iVar35 + -1 + iVar21];
        fVar5 = pfVar39[iVar25 + -1 + iVar30];
        fVar6 = pfVar39[iVar25 + -1 + iVar21];
        fVar7 = pfVar39[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar25 + iVar32] - pfVar39[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *(float *)((long)haarResponseX + lVar27) = (fVar72 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *pfVar38 = auVar51._0_4_ - (fVar72 - fVar6);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x60);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x60);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar72 = pfVar34[iVar32 + -1 + iVar30];
        fVar4 = pfVar34[iVar32 + -1 + iVar21];
        fVar5 = pfVar34[iVar35 + -1 + iVar30];
        fVar6 = pfVar34[iVar35 + -1 + iVar21];
        fVar7 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *pfVar38 = (fVar72 - fVar6) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *pfVar39 = auVar51._0_4_ - (fVar72 - fVar6);
      }
      iVar30 = (int)((double)((ulong)(0.0 <= fVar85) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar85) * -0x4020000000000000) + (double)fVar85);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 4);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 4);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar25 + -1 + iVar30];
        fVar5 = pfVar34[iVar25 + -1 + iVar21];
        fVar6 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar72 - fVar4)));
        *pfVar38 = (fVar85 - fVar5) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar72 - fVar4)));
        *pfVar39 = auVar51._0_4_ - (fVar85 - fVar5);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 100);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 100);
      if ((((iVar44 < 1) || (iVar30 < 1)) || (iimage->height < iVar18)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar85 = pfVar34[iVar32 + -1 + iVar30];
        fVar72 = pfVar34[iVar32 + -1 + iVar21];
        fVar4 = pfVar34[iVar35 + -1 + iVar30];
        fVar5 = pfVar34[iVar35 + -1 + iVar21];
        fVar6 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar72 - fVar4)));
        *pfVar38 = (fVar85 - fVar5) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar72 - fVar4)));
        *pfVar39 = auVar51._0_4_ - (fVar85 - fVar5);
      }
      iVar30 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 8);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 8);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar75 = pfVar34[iVar35 + -1 + iVar30];
        fVar85 = pfVar34[iVar35 + -1 + iVar21];
        fVar72 = pfVar34[iVar25 + -1 + iVar30];
        fVar4 = pfVar34[iVar25 + -1 + iVar21];
        fVar5 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar72)));
        *pfVar38 = (fVar75 - fVar4) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar72)));
        *pfVar39 = auVar51._0_4_ - (fVar75 - fVar4);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x68);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x68);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar75 = pfVar34[iVar32 + -1 + iVar30];
        fVar85 = pfVar34[iVar32 + -1 + iVar21];
        fVar72 = pfVar34[iVar35 + -1 + iVar30];
        fVar4 = pfVar34[iVar35 + -1 + iVar21];
        fVar5 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar72)));
        *pfVar38 = (fVar75 - fVar4) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar72)));
        *pfVar39 = auVar51._0_4_ - (fVar75 - fVar4);
      }
      iVar30 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0xc);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0xc);
      if ((((iVar42 < 1) || (iVar30 < 1)) || (iimage->height < iVar15)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x6c);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x6c);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar63 = vpbroadcastd_avx512vl();
      auVar63 = vpaddd_avx2(auVar63,_DAT_00576740);
      auVar63 = vcvtdq2ps_avx(auVar63);
      auVar13._4_4_ = fVar2;
      auVar13._0_4_ = fVar2;
      auVar13._8_4_ = fVar2;
      auVar13._12_4_ = fVar2;
      auVar13._16_4_ = fVar2;
      auVar13._20_4_ = fVar2;
      auVar13._24_4_ = fVar2;
      auVar13._28_4_ = fVar2;
      auVar14._4_4_ = fVar66;
      auVar14._0_4_ = fVar66;
      auVar14._8_4_ = fVar66;
      auVar14._12_4_ = fVar66;
      auVar14._16_4_ = fVar66;
      auVar14._20_4_ = fVar66;
      auVar14._24_4_ = fVar66;
      auVar14._28_4_ = fVar66;
      auVar52 = vfmadd132ps_fma(auVar63,auVar13,auVar14);
      auVar51 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar52),_DAT_00576760,0xd);
      bVar49 = (bool)((byte)(uVar23 >> 7) & 1);
      iVar30 = (int)((double)((ulong)bVar49 * 0x3fe0000000000000 +
                             (ulong)!bVar49 * -0x4020000000000000) + (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x10);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x10);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x70);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x70);
      if ((((iVar44 < 1) || (iVar30 < 1)) || (iimage->height < iVar18)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      bVar50 = (byte)uVar23;
      auVar51 = vpermilpd_avx((undefined1  [16])0x0,1);
      iVar30 = (int)((double)((ulong)(bVar50 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x14);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x14);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x74);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x74);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar51 = vmovshdup_avx((undefined1  [16])0x0);
      iVar30 = (int)((double)((ulong)(bVar50 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x18);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x18);
      if ((((iVar42 < 1) || (iVar30 < 1)) || (iimage->height < iVar15)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x78);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x78);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      iVar30 = (int)((double)((ulong)(bVar50 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 4 & 1) * -0x4020000000000000) + 0.0);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x1c);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x1c);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x7c);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x7c);
      if ((((iVar44 < 1) || (iVar30 < 1)) || (iimage->height < iVar18)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar51 = vpermilps_avx(auVar52,0xff);
      iVar30 = (int)((double)((ulong)(bVar50 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x20);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x20);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x80);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x80);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar51 = vpermilpd_avx(auVar52,1);
      iVar30 = (int)((double)((ulong)(bVar50 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x24);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x24);
      if ((((iVar42 < 1) || (iVar30 < 1)) || (iimage->height < iVar15)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x84);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x84);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar51 = vmovshdup_avx(auVar52);
      iVar30 = (int)((double)((ulong)(bVar50 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x28);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x28);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x88);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x88);
      if ((((iVar44 < 1) || (iVar30 < 1)) || (iimage->height < iVar18)) ||
         (iVar21 = iVar1 + iVar30, iimage->width < iVar21)) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      local_138 = auVar52._0_4_;
      iVar30 = (int)((double)((ulong)(bVar50 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 & 1) * -0x4020000000000000) + (double)local_138);
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x2c);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x2c);
      if (((iVar42 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar15 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar42,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar32 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar25 = iVar33 * iVar16;
        fVar65 = pfVar34[iVar33 * iVar17 + -1 + iVar30];
        iVar35 = iVar33 * (iVar1 + -1 + iVar42);
        fVar71 = pfVar34[iVar35 + -1 + iVar30];
        fVar75 = pfVar34[iVar35 + -1 + iVar21];
        fVar85 = pfVar34[iVar25 + -1 + iVar30];
        fVar72 = pfVar34[iVar25 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar17 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar25 + iVar32] - pfVar34[iVar35 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar27 + 0x8c);
      pfVar39 = (float *)((long)haarResponseY + lVar27 + 0x8c);
      if (((iVar44 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar18 || (iVar21 = iVar1 + iVar30, iimage->width < iVar21)))) {
        auVar91 = ZEXT1664(auVar91._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar44,iVar30,iVar46,pfVar38,pfVar39);
      }
      else {
        iVar25 = iVar30 + -1 + iVar46;
        pfVar34 = iimage->data;
        iVar33 = iimage->data_width;
        iVar35 = iVar33 * iVar19;
        fVar65 = pfVar34[iVar33 * iVar20 + -1 + iVar30];
        iVar32 = iVar33 * (iVar1 + -1 + iVar44);
        fVar71 = pfVar34[iVar32 + -1 + iVar30];
        fVar75 = pfVar34[iVar32 + -1 + iVar21];
        fVar85 = pfVar34[iVar35 + -1 + iVar30];
        fVar72 = pfVar34[iVar35 + -1 + iVar21];
        fVar4 = pfVar34[iVar33 * iVar20 + -1 + iVar21];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar25] - pfVar34[iVar32 + iVar25]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar38 = (fVar71 - fVar72) + auVar51._0_4_;
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar4)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar75 - fVar85)));
        *pfVar39 = auVar51._0_4_ - (fVar71 - fVar72);
      }
      auVar100 = ZEXT1664(ZEXT416((uint)fVar66));
      lVar27 = lVar27 + 0x30;
      bVar49 = iVar47 < 0;
      iVar47 = iVar47 + 0xc;
    } while (bVar49);
    lVar28 = lVar28 + 0xc0;
    bVar49 = (int)uVar22 < 10;
    uVar22 = uVar22 + 2;
  } while (bVar49);
LAB_001cc6ac:
  fVar66 = auVar100._0_4_;
  auVar99._8_4_ = 0x3effffff;
  auVar99._0_8_ = 0x3effffff3effffff;
  auVar99._12_4_ = 0x3effffff;
  auVar98._8_4_ = 0x80000000;
  auVar98._0_8_ = 0x8000000080000000;
  auVar98._12_4_ = 0x80000000;
  auVar51 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 0.5)),auVar98,0xf8);
  auVar51 = ZEXT416((uint)(fVar66 * 0.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 1.5)),auVar98,0xf8);
  auVar52 = ZEXT416((uint)(fVar66 * 1.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 2.5)),auVar98,0xf8);
  auVar53 = ZEXT416((uint)(fVar66 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 3.5)),auVar98,0xf8);
  auVar54 = ZEXT416((uint)(fVar66 * 3.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 4.5)),auVar98,0xf8);
  auVar55 = ZEXT416((uint)(fVar66 * 4.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 5.5)),auVar98,0xf8);
  auVar56 = ZEXT416((uint)(fVar66 * 5.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 6.5)),auVar98,0xf8);
  auVar57 = ZEXT416((uint)(fVar66 * 6.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 7.5)),auVar98,0xf8);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar66 * 7.5));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 8.5)),auVar98,0xf8);
  auVar59 = ZEXT416((uint)(fVar66 * 8.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 9.5)),auVar98,0xf8);
  auVar60 = ZEXT416((uint)(fVar66 * 9.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 10.5)),auVar98,0xf8);
  auVar61 = ZEXT416((uint)(fVar66 * 10.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar66 * 11.5)),auVar98,0xf8);
  auVar62 = ZEXT416((uint)(fVar66 * 11.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  fVar72 = auVar53._0_4_;
  fVar66 = fVar72 + auVar52._0_4_;
  fVar2 = fVar72 + auVar51._0_4_;
  fVar3 = fVar72 - auVar51._0_4_;
  fVar65 = fVar72 - auVar52._0_4_;
  fVar71 = fVar72 - auVar54._0_4_;
  fVar75 = fVar72 - auVar55._0_4_;
  fVar85 = fVar72 - auVar56._0_4_;
  fVar72 = fVar72 - auVar57._0_4_;
  fVar93 = auVar58._0_4_;
  fVar4 = fVar93 - auVar54._0_4_;
  fVar5 = fVar93 - auVar55._0_4_;
  fVar6 = fVar93 - auVar56._0_4_;
  fVar7 = fVar93 - auVar57._0_4_;
  fVar8 = fVar93 - auVar59._0_4_;
  fVar9 = fVar93 - auVar60._0_4_;
  fVar10 = fVar93 - auVar61._0_4_;
  fVar93 = fVar93 - auVar62._0_4_;
  gauss_s1_c0[0] = expf(fVar66 * fVar66 * fVar64);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar64);
  gauss_s1_c0[2] = expf(fVar3 * fVar3 * fVar64);
  gauss_s1_c0[3] = expf(fVar65 * fVar65 * fVar64);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar71 * fVar71 * fVar64);
  gauss_s1_c0[6] = expf(fVar75 * fVar75 * fVar64);
  gauss_s1_c0[7] = expf(fVar85 * fVar85 * fVar64);
  gauss_s1_c0[8] = expf(fVar72 * fVar72 * fVar64);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar64);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar64);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar64);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar64);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar64);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar64);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar64);
  gauss_s1_c1[8] = expf(fVar93 * fVar93 * fVar64);
  uVar23 = 0xfffffff8;
  lVar28 = 0;
  fVar66 = 0.0;
  auVar70._8_4_ = 0x7fffffff;
  auVar70._0_8_ = 0x7fffffff7fffffff;
  auVar70._12_4_ = 0x7fffffff;
  lVar27 = 0;
  lVar40 = 0;
  do {
    pfVar38 = gauss_s1_c1;
    uVar22 = (uint)uVar23;
    if (uVar22 != 7) {
      pfVar38 = gauss_s1_c0;
    }
    if (uVar22 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    lVar27 = (long)(int)lVar27;
    iVar46 = (int)lVar40;
    lVar40 = (long)iVar46;
    lVar37 = (long)haarResponseX + lVar28;
    lVar29 = (long)haarResponseY + lVar28;
    uVar36 = 0xfffffff8;
    uVar31 = 0;
    do {
      pfVar39 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar39 = gauss_s1_c0;
      }
      if (uVar36 == 0xfffffff8) {
        pfVar39 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      auVar91 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar26 = uVar31;
      lVar43 = lVar37;
      lVar45 = lVar29;
      do {
        lVar41 = 0;
        pfVar34 = (float *)((long)pfVar38 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar2 = pfVar39[uVar24] * *pfVar34;
          auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar45 + lVar41 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar41 * 4)),0x10);
          auVar87._0_4_ = fVar2 * auVar51._0_4_;
          auVar87._4_4_ = fVar2 * auVar51._4_4_;
          auVar87._8_4_ = fVar2 * auVar51._8_4_;
          auVar87._12_4_ = fVar2 * auVar51._12_4_;
          auVar51 = vandps_avx(auVar87,auVar70);
          auVar51 = vmovlhps_avx(auVar87,auVar51);
          auVar74._0_4_ = auVar91._0_4_ + auVar51._0_4_;
          auVar74._4_4_ = auVar91._4_4_ + auVar51._4_4_;
          auVar74._8_4_ = auVar91._8_4_ + auVar51._8_4_;
          auVar74._12_4_ = auVar91._12_4_ + auVar51._12_4_;
          auVar91 = ZEXT1664(auVar74);
          pfVar34 = pfVar34 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 9);
        uVar26 = uVar26 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar45 = lVar45 + 0x60;
      } while (uVar26 < uVar36 * 0x18 + 0x198);
      fVar2 = gauss_s2_arr[lVar40];
      auVar12._4_4_ = fVar2;
      auVar12._0_4_ = fVar2;
      auVar12._8_4_ = fVar2;
      auVar12._12_4_ = fVar2;
      auVar53 = vmulps_avx512vl(auVar74,auVar12);
      lVar40 = lVar40 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar27) = auVar53;
      auVar77._0_4_ = auVar53._0_4_ * auVar53._0_4_;
      auVar77._4_4_ = auVar53._4_4_ * auVar53._4_4_;
      auVar77._8_4_ = auVar53._8_4_ * auVar53._8_4_;
      auVar77._12_4_ = auVar53._12_4_ * auVar53._12_4_;
      auVar51 = vmovshdup_avx(auVar77);
      auVar52 = vfmadd231ss_fma(auVar51,auVar53,auVar53);
      auVar51 = vshufpd_avx(auVar53,auVar53,1);
      auVar52 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      auVar51 = vshufps_avx(auVar53,auVar53,0xff);
      auVar51 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      fVar66 = fVar66 + auVar51._0_4_;
      lVar27 = lVar27 + 4;
      uVar36 = uVar36 + 5;
      uVar31 = uVar31 + 0x78;
      lVar37 = lVar37 + 0x1e0;
      lVar29 = lVar29 + 0x1e0;
    } while (iVar46 + 4 != (int)lVar40);
    lVar28 = lVar28 + 0x14;
    uVar23 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar66 < 0.0) {
    fVar66 = sqrtf(fVar66);
  }
  else {
    auVar51 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
    fVar66 = auVar51._0_4_;
  }
  auVar91 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar66)));
  lVar28 = 0;
  do {
    auVar95 = vmulps_avx512f(auVar91,*(undefined1 (*) [64])(ipoint->descriptor + lVar28));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar28) = auVar95;
    lVar28 = lVar28 + 0x10;
  } while (lVar28 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}